

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O2

string * __thiscall
OpenMD::ElementsTable::GetName_abi_cxx11_
          (string *__return_storage_ptr__,ElementsTable *this,int atomicnum)

{
  pointer ppEVar1;
  allocator<char> local_19;
  
  if (this->init_ == false) {
    Init(this);
  }
  if ((atomicnum < 0) ||
     (ppEVar1 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3) <=
     atomicnum)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_19);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&ppEVar1[(uint)atomicnum]->name_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ElementsTable::GetName(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return ("Unknown");

    return (elements_[atomicnum]->GetName());
  }